

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

bool __thiscall cmSourceFileLocation::Matches(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmMakefile *this_00;
  cmSourceFileLocation *loc_00;
  bool bVar1;
  char *pcVar2;
  cmSourceFileLocation *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string sStack_58;
  string local_38;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0xd8,"bool cmSourceFileLocation::Matches(const cmSourceFileLocation &)");
  }
  if (this->AmbiguousExtension == loc->AmbiguousExtension) {
    if ((this->Name)._M_string_length != (loc->Name)._M_string_length) {
      return false;
    }
    bVar1 = cmsys::SystemTools::ComparePath(&this->Name,&loc->Name);
  }
  else {
    this_01 = this;
    loc_00 = loc;
    if (this->AmbiguousExtension != false) {
      this_01 = loc;
      loc_00 = this;
    }
    bVar1 = MatchesAmbiguousExtension(this_01,loc_00);
  }
  if (bVar1 == false) {
    return false;
  }
  if (this->AmbiguousDirectory == false) {
    if (loc->AmbiguousDirectory != false) {
      pcVar2 = cmMakefile::GetCurrentSourceDirectory(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&sStack_58,&loc->Directory,pcVar2);
      pcVar2 = cmMakefile::GetCurrentBinaryDirectory(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_38,&loc->Directory,pcVar2);
      __rhs = &this->Directory;
      goto LAB_0030939c;
    }
  }
  else {
    if (loc->AmbiguousDirectory == false) {
      pcVar2 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&sStack_58,&this->Directory,pcVar2);
      pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_38,&this->Directory,pcVar2);
      __rhs = &loc->Directory;
LAB_0030939c:
      bVar1 = std::operator!=(&sStack_58,__rhs);
      if ((bVar1) && (bVar1 = std::operator!=(&local_38,__rhs), bVar1)) {
        std::__cxx11::string::~string((string *)&local_38);
LAB_003093c6:
        std::__cxx11::string::~string((string *)&sStack_58);
        return false;
      }
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&sStack_58);
      goto LAB_00309402;
    }
    this_00 = this->Makefile;
    if (this_00 != loc->Makefile) {
      std::__cxx11::string::string
                ((string *)&sStack_58,
                 "Matches error: Each side has a directory relative to a different location. This can occur when referencing a source file from a different directory.  This is not yet allowed."
                 ,(allocator *)&local_38);
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&sStack_58,false);
      goto LAB_003093c6;
    }
  }
  bVar1 = std::operator!=(&this->Directory,&loc->Directory);
  if (bVar1) {
    return false;
  }
LAB_00309402:
  Update(this,loc);
  return true;
}

Assistant:

bool cmSourceFileLocation::Matches(cmSourceFileLocation const& loc)
{
  assert(this->Makefile);
  if(this->AmbiguousExtension == loc.AmbiguousExtension)
    {
    // Both extensions are similarly ambiguous.  Since only the old fixed set
    // of extensions will be tried, the names must match at this point to be
    // the same file.
    if(this->Name.size() != loc.Name.size() ||
      !cmSystemTools::ComparePath(this->Name, loc.Name))
      {
      return false;
      }
    }
  else
    {
    const cmSourceFileLocation* loc1;
    const cmSourceFileLocation* loc2;
    if(this->AmbiguousExtension)
      {
      // Only "this" extension is ambiguous.
      loc1 = &loc;
      loc2 = this;
      }
    else
      {
      // Only "loc" extension is ambiguous.
      loc1 = this;
      loc2 = &loc;
      }
    if(!loc1->MatchesAmbiguousExtension(*loc2))
      {
      return false;
      }
    }

  if(!this->AmbiguousDirectory && !loc.AmbiguousDirectory)
    {
    // Both sides have absolute directories.
    if(this->Directory != loc.Directory)
      {
      return false;
      }
    }
  else if(this->AmbiguousDirectory && loc.AmbiguousDirectory)
    {
    if (this->Makefile == loc.Makefile)
      {
      // Both sides have directories relative to the same location.
      if(this->Directory != loc.Directory)
        {
        return false;
        }
      }
    else
      {
      // Each side has a directory relative to a different location.
      // This can occur when referencing a source file from a different
      // directory.  This is not yet allowed.
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR,
        "Matches error: Each side has a directory relative to a different "
        "location. This can occur when referencing a source file from a "
        "different directory.  This is not yet allowed."
        );
      return false;
      }
    }
  else if(this->AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    if(srcDir != loc.Directory &&
       binDir != loc.Directory)
      {
      return false;
      }
    }
  else if(loc.AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentBinaryDirectory());
    if(srcDir != this->Directory &&
       binDir != this->Directory)
      {
      return false;
      }
    }

  // File locations match.
  this->Update(loc);
  return true;
}